

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O0

lzma_ret stream_encode_in(lzma_stream_coder_conflict1 *coder,lzma_allocator *allocator,uint8_t *in,
                         size_t *in_pos,size_t in_size,lzma_action action)

{
  bool bVar1;
  bool bVar2;
  bool local_64;
  bool local_62;
  uint mythread_j_603;
  uint mythread_i_603;
  lzma_ret ret_1;
  uint mythread_j_582;
  uint mythread_i_582;
  _Bool block_error;
  _Bool finish;
  size_t thr_in_size;
  lzma_ret ret;
  lzma_action action_local;
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  lzma_allocator *allocator_local;
  lzma_stream_coder_conflict1 *coder_local;
  
  thr_in_size._4_4_ = action;
  _ret = in_size;
  in_size_local = (size_t)in_pos;
  in_pos_local = (size_t *)in;
  in_local = (uint8_t *)allocator;
  allocator_local = (lzma_allocator *)coder;
  while( true ) {
    local_62 = true;
    if (_ret <= *(ulong *)in_size_local) {
      local_62 = allocator_local[0xe].alloc != (_func_void_ptr_void_ptr_size_t_size_t *)0x0 &&
                 thr_in_size._4_4_ != LZMA_RUN;
    }
    if (!local_62) {
      return LZMA_OK;
    }
    if ((allocator_local[0xe].alloc == (_func_void_ptr_void_ptr_size_t_size_t *)0x0) &&
       (thr_in_size._0_4_ =
             get_thread((lzma_stream_coder_conflict1 *)allocator_local,(lzma_allocator *)in_local),
       allocator_local[0xe].alloc == (_func_void_ptr_void_ptr_size_t_size_t *)0x0)) {
      return (lzma_ret)thr_in_size;
    }
    _mythread_i_582 = *(_func_void_void_ptr_void_ptr **)(allocator_local[0xe].alloc + 0x10);
    lzma_bufcpy((uint8_t *)in_pos_local,(size_t *)in_size_local,_ret,
                *(uint8_t **)(allocator_local[0xe].alloc + 8),(size_t *)&mythread_i_582,
                (size_t)allocator_local->free);
    local_64 = true;
    if (_mythread_i_582 != allocator_local->free) {
      local_64 = *(ulong *)in_size_local == _ret && thr_in_size._4_4_ != LZMA_RUN;
    }
    bVar2 = false;
    bVar1 = false;
    while (!bVar1) {
      mythread_mutex_lock((mythread_mutex *)(allocator_local[0xe].alloc + 0x160));
      bVar1 = false;
      while (!bVar1) {
        if (*(int *)allocator_local[0xe].alloc == 0) {
          bVar2 = true;
        }
        else {
          *(_func_void_void_ptr_void_ptr **)(allocator_local[0xe].alloc + 0x10) = _mythread_i_582;
          if (local_64) {
            *(undefined4 *)allocator_local[0xe].alloc = 2;
          }
          mythread_cond_signal((mythread_cond *)(allocator_local[0xe].alloc + 0x188));
        }
        bVar1 = true;
      }
      bVar1 = true;
    }
    mythread_mutex_unlock((mythread_mutex *)(allocator_local[0xe].alloc + 0x160));
    if (bVar2) break;
    if (local_64) {
      allocator_local[0xe].alloc = (_func_void_ptr_void_ptr_size_t_size_t *)0x0;
    }
  }
  bVar1 = false;
  while (!bVar1) {
    mythread_mutex_lock((mythread_mutex *)(allocator_local + 0xf));
    bVar1 = false;
    while (!bVar1) {
      mythread_j_603 = *(uint *)((long)&allocator_local[0xc].opaque + 4);
      bVar1 = true;
    }
    bVar1 = true;
  }
  mythread_mutex_unlock((mythread_mutex *)(allocator_local + 0xf));
  return mythread_j_603;
}

Assistant:

static lzma_ret
stream_encode_in(lzma_stream_coder *coder, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, lzma_action action)
{
	while (*in_pos < in_size
			|| (coder->thr != NULL && action != LZMA_RUN)) {
		if (coder->thr == NULL) {
			// Get a new thread.
			const lzma_ret ret = get_thread(coder, allocator);
			if (coder->thr == NULL)
				return ret;
		}

		// Copy the input data to thread's buffer.
		size_t thr_in_size = coder->thr->in_size;
		lzma_bufcpy(in, in_pos, in_size, coder->thr->in,
				&thr_in_size, coder->block_size);

		// Tell the Block encoder to finish if
		//  - it has got block_size bytes of input; or
		//  - all input was used and LZMA_FINISH, LZMA_FULL_FLUSH,
		//    or LZMA_FULL_BARRIER was used.
		//
		// TODO: LZMA_SYNC_FLUSH and LZMA_SYNC_BARRIER.
		const bool finish = thr_in_size == coder->block_size
				|| (*in_pos == in_size && action != LZMA_RUN);

		bool block_error = false;

		mythread_sync(coder->thr->mutex) {
			if (coder->thr->state == THR_IDLE) {
				// Something has gone wrong with the Block
				// encoder. It has set coder->thread_error
				// which we will read a few lines later.
				block_error = true;
			} else {
				// Tell the Block encoder its new amount
				// of input and update the state if needed.
				coder->thr->in_size = thr_in_size;

				if (finish)
					coder->thr->state = THR_FINISH;

				mythread_cond_signal(&coder->thr->cond);
			}
		}

		if (block_error) {
			lzma_ret ret;

			mythread_sync(coder->mutex) {
				ret = coder->thread_error;
			}

			return ret;
		}

		if (finish)
			coder->thr = NULL;
	}

	return LZMA_OK;
}